

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  long in_RSI;
  int in_EDI;
  vector<char,_std::allocator<char>_> data;
  Communicator server1;
  Communicator server0;
  int port;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  size_type in_stack_ffffffffffffff78;
  vector<char,_std::allocator<char>_> *this;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  duration<long,_std::ratio<1L,_1000L>_> *__rtime;
  int local_64;
  duration<long,std::ratio<1l,1000l>> local_60 [15];
  undefined1 local_51 [41];
  Communicator local_28 [8];
  Communicator local_20 [12];
  int local_14;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s port\n");
  if (1 < local_8) {
    local_14 = atoi(*(char **)(local_10 + 8));
    GGSock::Communicator::Communicator(local_20,false);
    GGSock::Communicator::Communicator(local_28,false);
    __rtime = (duration<long,_std::ratio<1L,_1000L>_> *)local_51;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (allocator_type *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    do {
      GGSock::Communicator::listen((int)local_20,local_14,0);
      GGSock::Communicator::listen((int)local_28,local_14,0);
      bVar1 = GGSock::Communicator::isConnected();
      if ((bVar1 & 1) != 0) {
        printf("sending client 1\n");
        GGSock::Communicator::send((ushort)local_20);
        this = (vector<char,_std::allocator<char>_> *)(local_51 + 1);
        pcVar3 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x10340d);
        uVar2 = (uint)pcVar3;
        std::vector<char,_std::allocator<char>_>::size(this);
        GGSock::Communicator::send((ushort)local_20,(char *)0x5e,uVar2);
      }
      bVar1 = GGSock::Communicator::isConnected();
      if ((bVar1 & 1) != 0) {
        printf("sending client 2\n");
        GGSock::Communicator::send((ushort)local_28);
        pcVar3 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1034d6);
        std::vector<char,_std::allocator<char>_>::size
                  ((vector<char,_std::allocator<char>_> *)(local_51 + 1));
        GGSock::Communicator::send((ushort)local_28,(char *)0x5e,(uint)pcVar3);
      }
      GGSock::Communicator::update();
      GGSock::Communicator::update();
      local_64 = 100;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_60,&local_64);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(__rtime);
    } while( true );
  }
  return -1;
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s port\n", argv[0]);
    if (argc < 2) {
        return -1;
    }

    int port = atoi(argv[1]);

    GGSock::Communicator server0(false);
    GGSock::Communicator server1(false);

    std::vector<char> data(128*1024);

    while (true) {
        server0.listen(port, 0);
        server1.listen(port, 0);

        if (server0.isConnected()) {
            printf("sending client 1\n");
            server0.send(95);
            server0.send(94, data.data(), data.size());
        }

        if (server1.isConnected()) {
            printf("sending client 2\n");
            server1.send(95);
            server1.send(94, data.data(), data.size());
        }

        server0.update();
        server1.update();

		std::this_thread::sleep_for(std::chrono::milliseconds(100));
	}

    return 0;
}